

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

path * boost::filesystem::detail::weakly_canonical
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  path *ppVar8;
  string *__return_storage_ptr___00;
  _Alloc_hider _Var9;
  path head;
  file_status head_status;
  path tail;
  error_code tmp_ec;
  iterator itr;
  path local_110;
  path local_f0;
  path *local_d0;
  size_type local_c8;
  string *local_c0;
  error_code *local_b8;
  path local_b0;
  path local_90;
  error_code local_70;
  iterator local_60;
  
  local_110.m_pathname._M_dataplus._M_p = (pointer)&local_110.m_pathname.field_2;
  pcVar3 = (p->m_pathname)._M_dataplus._M_p;
  local_c0 = (string *)__return_storage_ptr__;
  local_b8 = ec;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + (p->m_pathname)._M_string_length);
  local_b0.m_pathname._M_dataplus._M_p = (pointer)&local_b0.m_pathname.field_2;
  local_b0.m_pathname._M_string_length = 0;
  local_b0.m_pathname.field_2._M_local_buf[0] = '\0';
  local_70.m_val = 0;
  local_70.m_cat = system::system_category();
  path::end(p);
  while (local_110.m_pathname._M_string_length != 0) {
    status((detail *)&local_f0,&local_110,&local_70);
    iVar5 = (int)local_f0.m_pathname._M_dataplus._M_p;
    bVar6 = anon_unknown.dwarf_59d9::error
                      ((uint)((int)local_f0.m_pathname._M_dataplus._M_p == 0),&local_110,local_b8,
                       "boost::filesystem::weakly_canonical");
    __return_storage_ptr___00 = local_c0;
    if (bVar6) goto LAB_0010cf8a;
    if (iVar5 != 1) break;
    path::remove_filename(&local_110);
    path::m_path_iterator_decrement(&local_60);
  }
  paVar1 = &local_f0.m_pathname.field_2;
  bVar6 = false;
  while( true ) {
    path::end(p);
    bVar7 = local_c8 == local_60.m_pos;
    bVar4 = local_60.m_path_ptr == local_d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.m_pathname._M_dataplus._M_p,
                      local_f0.m_pathname.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr___00 = local_c0;
    if (bVar7 && bVar4) break;
    path::operator/=(&local_b0,&local_60.m_element);
    if (((local_60.m_element.m_pathname._M_string_length < 3) &&
        (*local_60.m_element.m_pathname._M_dataplus._M_p == '.')) &&
       ((local_60.m_element.m_pathname._M_string_length == 1 ||
        (local_60.m_element.m_pathname._M_dataplus._M_p[1] == '.')))) {
      bVar6 = true;
    }
    path::m_path_iterator_increment(&local_60);
  }
  if (local_110.m_pathname._M_string_length == 0) {
    path::lexically_normal((path *)local_c0,p);
  }
  else {
    current_path(&local_f0,(error_code *)0x0);
    canonical(&local_90,&local_110,&local_f0,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.m_pathname._M_dataplus._M_p,
                      local_f0.m_pathname.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_90);
    paVar2 = &local_90.m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_90.m_pathname._M_dataplus._M_p,
                      local_90.m_pathname.field_2._M_allocated_capacity + 1);
    }
    bVar7 = anon_unknown.dwarf_59d9::error
                      (local_70.m_val,&local_110,local_b8,"boost::filesystem::weakly_canonical");
    if (bVar7) {
LAB_0010cf8a:
      *(string **)__return_storage_ptr___00 = __return_storage_ptr___00 + 0x10;
      *(size_type *)(__return_storage_ptr___00 + 8) = 0;
      __return_storage_ptr___00[0x10] = (string)0x0;
    }
    else if (local_b0.m_pathname._M_string_length == 0) {
      *(string **)__return_storage_ptr___00 = __return_storage_ptr___00 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (__return_storage_ptr___00,local_110.m_pathname._M_dataplus._M_p,
                 local_110.m_pathname._M_dataplus._M_p + local_110.m_pathname._M_string_length);
    }
    else {
      local_f0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
      if (bVar6) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_110.m_pathname._M_dataplus._M_p,
                   local_110.m_pathname._M_dataplus._M_p + local_110.m_pathname._M_string_length);
        ppVar8 = path::operator/=(&local_f0,&local_b0);
        pcVar3 = (ppVar8->m_pathname)._M_dataplus._M_p;
        local_90.m_pathname._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + (ppVar8->m_pathname)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.m_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.m_pathname._M_dataplus._M_p,
                          local_f0.m_pathname.field_2._M_allocated_capacity + 1);
        }
        path::lexically_normal((path *)__return_storage_ptr___00,&local_90);
        local_f0.m_pathname.field_2._M_allocated_capacity =
             local_90.m_pathname.field_2._M_allocated_capacity;
        _Var9._M_p = local_90.m_pathname._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.m_pathname._M_dataplus._M_p == paVar2) goto LAB_0010d026;
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_110.m_pathname._M_dataplus._M_p,
                   local_110.m_pathname._M_dataplus._M_p + local_110.m_pathname._M_string_length);
        ppVar8 = path::operator/=(&local_f0,&local_b0);
        *(string **)__return_storage_ptr___00 = __return_storage_ptr___00 + 0x10;
        pcVar3 = (ppVar8->m_pathname)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  (__return_storage_ptr___00,pcVar3,pcVar3 + (ppVar8->m_pathname)._M_string_length);
        _Var9._M_p = local_f0.m_pathname._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.m_pathname._M_dataplus._M_p == paVar1) goto LAB_0010d026;
      }
      operator_delete(_Var9._M_p,local_f0.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0010d026:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_element.m_pathname._M_dataplus._M_p != &local_60.m_element.m_pathname.field_2) {
    operator_delete(local_60.m_element.m_pathname._M_dataplus._M_p,
                    local_60.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != &local_b0.m_pathname.field_2) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_b0.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_b0.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_pathname._M_dataplus._M_p != &local_110.m_pathname.field_2) {
    operator_delete(local_110.m_pathname._M_dataplus._M_p,
                    local_110.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return (path *)__return_storage_ptr___00;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path weakly_canonical(const path& p, system::error_code* ec)
  {
    path head(p);
    path tail;
    system::error_code tmp_ec;
    path::iterator itr = p.end();

    for (; !head.empty(); --itr)
    {
      file_status head_status = status(head, tmp_ec);
      if (error(head_status.type() == fs::status_error,
        head, ec, "boost::filesystem::weakly_canonical"))
        return path();
      if (head_status.type() != fs::file_not_found)
        break;
      head.remove_filename();
    }

    bool tail_has_dots = false;
    for (; itr != p.end(); ++itr)
    { 
      tail /= *itr;
      // for a later optimization, track if any dot or dot-dot elements are present
      if (itr->native().size() <= 2
        && itr->native()[0] == dot
        && (itr->native().size() == 1 || itr->native()[1] == dot))
        tail_has_dots = true;
    }
    
    if (head.empty())
      return p.lexically_normal();
    head = canonical(head, tmp_ec);
    if (error(tmp_ec.value(), head, ec, "boost::filesystem::weakly_canonical"))
      return path();
    return tail.empty()
      ? head
      : (tail_has_dots  // optimization: only normalize if tail had dot or dot-dot element
          ? (head/tail).lexically_normal()  
          : head/tail);
  }